

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O1

IterateResult __thiscall deqp::gles2::Functional::BlendCase::iterate(BlendCase *this)

{
  TextureFormat TVar1;
  ReferenceQuadRenderer *pRVar2;
  RenderContext *context;
  TestLog *log;
  bool bVar3;
  int i;
  deUint32 dVar4;
  GLenum GVar5;
  int iVar6;
  RenderTarget *pRVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  int i_3;
  int iVar11;
  IterateResult IVar12;
  uint uVar13;
  uint y;
  qpTestResult testResult;
  void *pvVar14;
  pointer pBVar15;
  Surface referenceImg;
  Surface renderedImg;
  Vector<unsigned_int,_4> res_1;
  Vector<unsigned_int,_4> res_2;
  Vector<unsigned_int,_4> res;
  UVec4 compareThreshold;
  PixelBufferAccess nullAccess;
  FragmentOperationState referenceState;
  Random rnd;
  Surface local_368;
  Surface local_350;
  ConstPixelBufferAccess local_338;
  ConstPixelBufferAccess local_308;
  TextureFormat local_2d8;
  undefined8 uStack_2d0;
  uint local_2bc;
  UVec4 local_2b8;
  int aiStack_2a0 [4];
  uint auStack_290 [4];
  int aiStack_280 [4];
  TextureFormat local_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  _func_int **local_258;
  ios_base local_1e8 [264];
  FragmentOperationState local_e0;
  deRandom local_40;
  
  dVar4 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar13 = ((uint)this->m_curParamSetNdx >> 0x10 ^ this->m_curParamSetNdx ^ 0x3d) * 9;
  uVar13 = (uVar13 >> 4 ^ uVar13) * 0x27d4eb2d;
  deRandom_init(&local_40,uVar13 >> 0xf ^ dVar4 ^ uVar13);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar7->m_width;
  iVar11 = this->m_viewportW;
  dVar4 = deRandom_getUint32(&local_40);
  uVar13 = dVar4 % ((iVar6 - iVar11) + 1U);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = pRVar7->m_height;
  iVar11 = this->m_viewportH;
  dVar4 = deRandom_getUint32(&local_40);
  y = dVar4 % ((iVar6 - iVar11) + 1U);
  tcu::Surface::Surface(&local_350,this->m_viewportW,this->m_viewportH);
  tcu::Surface::Surface(&local_368,this->m_viewportH,this->m_viewportH);
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pBVar15 = (this->m_paramSets).
            super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_curParamSetNdx;
  rr::FragmentOperationState::FragmentOperationState(&local_e0);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"RGB equation = ",0xf);
  pcVar8 = glu::getBlendEquationName(pBVar15->equationRGB);
  iVar6 = (int)(ostringstream *)&local_258;
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"RGB src func = ",0xf);
  pcVar8 = glu::getBlendFactorName(pBVar15->srcFuncRGB);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"RGB dst func = ",0xf);
  pcVar8 = glu::getBlendFactorName(pBVar15->dstFuncRGB);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Alpha equation = ",0x11)
  ;
  pcVar8 = glu::getBlendEquationName(pBVar15->equationAlpha);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Alpha src func = ",0x11)
  ;
  pcVar8 = glu::getBlendFactorName(pBVar15->srcFuncAlpha);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Alpha dst func = ",0x11)
  ;
  pcVar8 = glu::getBlendFactorName(pBVar15->dstFuncAlpha);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear(iVar6 + (int)local_258[-3]);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,pcVar8,sVar9);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  local_260 = (undefined1  [8])TVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_258);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,"Blend color = (",0xf);
  std::ostream::_M_insert<double>((double)(pBVar15->blendColor).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar15->blendColor).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar15->blendColor).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,", ",2);
  std::ostream::_M_insert<double>((double)(pBVar15->blendColor).m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_260,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_258);
  std::ios_base::~ios_base(local_1e8);
  glwBlendEquationSeparate(pBVar15->equationRGB,pBVar15->equationAlpha);
  GVar5 = glwGetError();
  glu::checkError(GVar5,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe7);
  glwBlendFuncSeparate
            (pBVar15->srcFuncRGB,pBVar15->dstFuncRGB,pBVar15->srcFuncAlpha,pBVar15->dstFuncAlpha);
  GVar5 = glwGetError();
  glu::checkError(GVar5,
                  "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe8);
  glwBlendColor((pBVar15->blendColor).m_data[0],(pBVar15->blendColor).m_data[1],
                (pBVar15->blendColor).m_data[2],(pBVar15->blendColor).m_data[3]);
  GVar5 = glwGetError();
  glu::checkError(GVar5,
                  "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                  ,0xe9);
  local_e0.blendRGBState.equation = sglr::rr_util::mapGLBlendEquation(pBVar15->equationRGB);
  local_e0.blendRGBState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar15->srcFuncRGB);
  local_e0.blendRGBState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar15->dstFuncRGB);
  local_e0.blendAState.equation = sglr::rr_util::mapGLBlendEquation(pBVar15->equationAlpha);
  local_e0.blendAState.srcFunc = sglr::rr_util::mapGLBlendFunc(pBVar15->srcFuncAlpha);
  local_e0.blendAState.dstFunc = sglr::rr_util::mapGLBlendFunc(pBVar15->dstFuncAlpha);
  local_e0.blendColor.m_data._0_8_ = *(undefined8 *)(pBVar15->blendColor).m_data;
  local_e0.blendColor.m_data._8_8_ = *(undefined8 *)((pBVar15->blendColor).m_data + 2);
  glwDisable(0xbe2);
  glwViewport(uVar13,y,this->m_viewportW,this->m_viewportH);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)local_260);
  local_e0.blendMode = BLENDMODE_NONE;
  pRVar2 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_338,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_308,(PixelBufferAccess *)&local_338);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,(PixelBufferAccess *)&local_308,(PixelBufferAccess *)local_260,
             (PixelBufferAccess *)local_260,&this->m_firstQuadInt,&local_e0);
  local_e0.blendMode = BLENDMODE_STANDARD;
  pRVar2 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_338,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess
            ((PixelBufferAccess *)&local_308,(PixelBufferAccess *)&local_338);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar2,(PixelBufferAccess *)&local_308,(PixelBufferAccess *)local_260,
             (PixelBufferAccess *)local_260,&this->m_secondQuadInt,&local_e0);
  local_338.m_format.order = RGBA;
  local_338.m_format.type = UNORM_INT8;
  pvVar14 = (void *)local_368.m_pixels.m_cap;
  if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_368.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_308,&local_338.m_format,local_368.m_width,
             local_368.m_height,1,pvVar14);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&local_338,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_308,(EVP_PKEY_CTX *)&local_338);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_338.m_format.order = RGBA;
  local_338.m_format.type = UNORM_INT8;
  pvVar14 = (void *)local_350.m_pixels.m_cap;
  if ((void *)local_350.m_pixels.m_cap != (void *)0x0) {
    pvVar14 = local_350.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_308,&local_338.m_format,local_350.m_width,
             local_350.m_height,1,pvVar14);
  glu::readPixels(context,uVar13,y,(PixelBufferAccess *)&local_308);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = (pRVar7->m_pixelFormat).alphaBits;
  local_2bc = 0;
  if (0 < iVar6) {
    local_2bc = 0x1000000 << (8U - (char)iVar6 & 0x1f);
  }
  local_2bc = 0x100 << (8U - (char)(pRVar7->m_pixelFormat).greenBits & 0x1f) |
              1 << ((byte)(8 - (char)(pRVar7->m_pixelFormat).redBits) & 0x1f) |
              0x10000 << (8U - (char)(pRVar7->m_pixelFormat).blueBits & 0x1f) | local_2bc;
  tcu::RGBA::toIVec((RGBA *)&local_270);
  local_2d8 = local_270;
  uStack_2d0 = uStack_268;
  lVar10 = 0;
  do {
    aiStack_280[lVar10] = 5;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_338.m_format.order = R;
  local_338.m_format.type = SNORM_INT8;
  local_338.m_size.m_data[0] = 0;
  local_338.m_size.m_data[1] = 0;
  lVar10 = 0;
  do {
    local_338.m_size.m_data[lVar10 + -2] = aiStack_280[lVar10] * (&local_2d8.order)[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    auStack_290[lVar10] = 2;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_308.m_format.order = R;
  local_308.m_format.type = SNORM_INT8;
  local_308.m_size.m_data[0] = 0;
  local_308.m_size.m_data[1] = 0;
  lVar10 = 0;
  do {
    local_308.m_size.m_data[lVar10 + -2] =
         (uint)local_338.m_size.m_data[lVar10 + -2] / auStack_290[lVar10];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  lVar10 = 0;
  do {
    aiStack_2a0[lVar10] = 3;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  local_2b8.m_data[0] = 0;
  local_2b8.m_data[1] = 0;
  local_2b8.m_data[2] = 0;
  local_2b8.m_data[3] = 0;
  lVar10 = 0;
  do {
    local_2b8.m_data[lVar10] = aiStack_2a0[lVar10] + local_308.m_size.m_data[lVar10 + -2];
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_338.m_format.order = RGBA;
  local_338.m_format.type = UNORM_INT8;
  if ((void *)local_368.m_pixels.m_cap != (void *)0x0) {
    local_368.m_pixels.m_cap = (size_t)local_368.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_308,&local_338.m_format,local_368.m_width,
             local_368.m_height,1,(void *)local_368.m_pixels.m_cap);
  local_2d8.order = RGBA;
  local_2d8.type = UNORM_INT8;
  if ((void *)local_350.m_pixels.m_cap != (void *)0x0) {
    local_350.m_pixels.m_cap = (size_t)local_350.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_338,&local_2d8,local_350.m_width,local_350.m_height,1,
             (void *)local_350.m_pixels.m_cap);
  bVar3 = tcu::intThresholdCompare
                    (log,"CompareResult","Image Comparison Result",&local_308,&local_338,&local_2b8,
                     COMPARE_LOG_RESULT);
  if (bVar3) {
    iVar6 = this->m_curParamSetNdx + 1;
    this->m_curParamSetNdx = iVar6;
    iVar11 = (int)((ulong)((long)(this->m_paramSets).
                                 super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_paramSets).
                                super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    IVar12 = CONTINUE;
    if (SBORROW4(iVar6,iVar11 * -0x33333333) != iVar6 + iVar11 * 0x33333333 < 0) goto LAB_00f7de83;
    pcVar8 = "Passed";
    testResult = QP_TEST_RESULT_PASS;
  }
  else {
    pcVar8 = "Image compare failed";
    testResult = QP_TEST_RESULT_FAIL;
  }
  IVar12 = STOP;
  tcu::TestContext::setTestResult(((this->super_TestCase).m_context)->m_testCtx,testResult,pcVar8);
LAB_00f7de83:
  tcu::Surface::~Surface(&local_368);
  tcu::Surface::~Surface(&local_350);
  return IVar12;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth() - m_viewportW);
	int								viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportH);
	tcu::Surface					renderedImg		(m_viewportW, m_viewportH);
	tcu::Surface					referenceImg	(m_viewportH, m_viewportH);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportW, m_viewportH);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.

	UVec4 compareThreshold = m_context.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(3); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", referenceImg.getAccess(), renderedImg.getAccess(), compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}